

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSolutionMatrix.cpp
# Opt level: O3

TPZBaseMatrix * __thiscall
TPZSolutionMatrix::operator_cast_to_TPZBaseMatrix_(TPZSolutionMatrix *this)

{
  if (this->fBaseMatrix != (TPZBaseMatrix *)0x0) {
    return this->fBaseMatrix;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"TPZBaseMatrix &TPZSolutionMatrix::operator TPZBaseMatrix &()",
             0x3c);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr," trying to access undefined matrix\n",0x23);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Aborting...",0xb);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/TPZSolutionMatrix.cpp"
             ,0x8f);
}

Assistant:

TPZSolutionMatrix::operator TPZBaseMatrix &(){
  if(!fBaseMatrix){
    PZError<<__PRETTY_FUNCTION__;
    PZError<<" trying to access undefined matrix\n";
    PZError<<"Aborting...";
    DebugStop();
  }
  return *fBaseMatrix;
}